

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexReinit(Fts5Index *p)

{
  int iVar1;
  undefined1 local_38 [8];
  Fts5Structure s;
  Fts5Index *p_local;
  
  s.aLevel[0].aSeg = (Fts5StructureSegment *)p;
  fts5StructureInvalidate(p);
  memset(local_38,0,0x28);
  fts5DataWrite((Fts5Index *)s.aLevel[0].aSeg,1,"",0);
  fts5StructureWrite((Fts5Index *)s.aLevel[0].aSeg,(Fts5Structure *)local_38);
  iVar1 = fts5IndexReturn((Fts5Index *)s.aLevel[0].aSeg);
  return iVar1;
}

Assistant:

static int sqlite3Fts5IndexReinit(Fts5Index *p){
  Fts5Structure s;
  fts5StructureInvalidate(p);
  memset(&s, 0, sizeof(Fts5Structure));
  fts5DataWrite(p, FTS5_AVERAGES_ROWID, (const u8*)"", 0);
  fts5StructureWrite(p, &s);
  return fts5IndexReturn(p);
}